

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_profiler.hpp
# Opt level: O0

void __thiscall fp::collector::collector(collector *this,string *name)

{
  time_point tVar1;
  time_point tVar2;
  ostream *poVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  string local_200 [32];
  native_handle_type local_1e0;
  ostringstream local_1c8 [8];
  ostringstream os;
  undefined4 local_50;
  undefined4 local_4c;
  string *local_48;
  string *name_local;
  collector *this_local;
  undefined4 *local_30;
  thread_accumulator *local_28;
  undefined8 local_20;
  undefined4 *local_18;
  steady_accumulator *local_10;
  
  local_48 = name;
  name_local = (string *)this;
  tVar1 = boost::chrono::thread_clock::now();
  (this->m_thread_last).d_.rep_ = (rep)tVar1.d_.rep_;
  tVar2 = boost::chrono::steady_clock::now();
  (this->m_steady_last).d_.rep_ = (rep)tVar2.d_.rep_;
  this->m_count = 0;
  local_28 = &this->m_thread_accumulator;
  local_4c = 0;
  local_30 = &local_4c;
  this_local = (collector *)0x0;
  local_28->rep_ = 0;
  local_10 = &this->m_steady_accumulator;
  local_50 = 0;
  local_18 = &local_50;
  local_20 = 0;
  local_10->rep_ = 0;
  tVar2 = boost::chrono::steady_clock::now();
  (this->m_last_report).d_.rep_ = (rep)tVar2.d_.rep_;
  std::__cxx11::string::string((string *)&this->m_fmt);
  std::__cxx11::ostringstream::ostringstream(local_1c8);
  poVar3 = std::operator<<((ostream *)local_1c8,"[FP] ");
  pbVar4 = (basic_ostream<char,_std::char_traits<char>_> *)std::ostream::operator<<(poVar3,std::hex)
  ;
  local_1e0 = (native_handle_type)std::this_thread::get_id();
  pbVar4 = std::operator<<(pbVar4,(id)local_1e0);
  poVar3 = std::operator<<((ostream *)pbVar4," ");
  poVar3 = std::operator<<(poVar3,(string *)local_48);
  std::operator<<(poVar3," #%-7lu %8.5F %8.5F %11.4F %11.4F\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)&this->m_fmt,local_200);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::ostringstream::~ostringstream(local_1c8);
  return;
}

Assistant:

collector(const std::string &name)
    : m_thread_last{thread_clock::now()},
      m_steady_last{steady_clock::now()},
      m_count{0},
      m_thread_accumulator{0},
      m_steady_accumulator{0},
      m_last_report{steady_clock::now()}
  {
    std::ostringstream os;
    os << "[FP] " << std::hex << std::this_thread::get_id() << " " << name << " #%-7lu %8.5F %8.5F %11.4F %11.4F\n";
    m_fmt = os.str();
  }